

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::CodeFolding(CodeFolding *this)

{
  _Rb_tree_header *p_Var1;
  
  WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__CodeFolding_01120050;
  p_Var1 = &(this->breakTails)._M_t._M_impl.super__Rb_tree_header;
  (this->breakTails)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->breakTails)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->breakTails)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->breakTails)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unoptimizables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->unoptimizables)._M_t._M_impl.super__Rb_tree_header;
  (this->unoptimizables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->breakTails)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->unreachableTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreachableTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreachableTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->returnTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->returnTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->returnTails).
  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unoptimizables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unoptimizables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unoptimizables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->modifieds)._M_t._M_impl.super__Rb_tree_header;
  (this->modifieds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->modifieds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->modifieds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->modifieds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->modifieds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }